

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O1

char * adt_str_cstr(adt_str_t *self)

{
  char cVar1;
  
  if (self != (adt_str_t *)0x0) {
    if (self->pAlloc == (uint8_t *)0x0) {
      cVar1 = adt_str_reserve(self,0);
    }
    else {
      cVar1 = '\0';
    }
    if (cVar1 == '\0') {
      if (self->s32Size <= self->s32Cur) {
        __assert_fail("self->s32Cur < self->s32Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_str.c"
                      ,0x23d,"const char *adt_str_cstr(adt_str_t *)");
      }
      if (self->pAlloc != (uint8_t *)0x0) {
        self->pAlloc[self->s32Cur] = '\0';
        return (char *)self->pAlloc;
      }
      __assert_fail("self->pAlloc != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_str.c"
                    ,0x23e,"const char *adt_str_cstr(adt_str_t *)");
    }
    self->lastError = cVar1;
  }
  return (char *)0x0;
}

Assistant:

const char* adt_str_cstr(adt_str_t *self)
{
   const char *retval = (const char*) 0;
   if(self != 0)
   {
      adt_error_t result = ADT_NO_ERROR;
      if(self->pAlloc == 0)
      {
         result = adt_str_reserve(self, 0);
      }
      if (result == ADT_NO_ERROR)
      {
         assert(self->s32Cur < self->s32Size);
         assert(self->pAlloc != 0);
         self->pAlloc[self->s32Cur] = 0u;
         retval = (const char*) self->pAlloc;
      }
      else
      {
         self->lastError = result;
      }
   }
   return retval;
}